

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,BufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  size_t *c1;
  bool bVar1;
  uint width;
  uint height;
  TestContext *this_00;
  TestLog *log;
  UVec2 *this_01;
  allocator<char> local_109;
  string local_108;
  undefined4 local_e8;
  allocator<char> local_e1;
  string local_e0;
  RGBA local_bc;
  ConstPixelBufferAccess local_b8;
  PixelBufferAccess local_80;
  undefined1 local_58 [8];
  Surface reference;
  Vec4 yellow;
  Vec4 green;
  ConstPixelBufferAccess *result_local;
  BufferRenderInstance *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&reference.m_pixels.m_cap,1.0,1.0,0.0,1.0);
  this_01 = &(this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize;
  width = tcu::Vector<unsigned_int,_2>::x(this_01);
  height = tcu::Vector<unsigned_int,_2>::y(this_01);
  tcu::Surface::Surface((Surface *)local_58,width,height);
  tcu::Surface::getAccess(&local_80,(Surface *)local_58);
  c1 = &reference.m_pixels.m_cap;
  drawQuadrantReferenceResult
            (&local_80,(Vec4 *)c1,(Vec4 *)(yellow.m_data + 2),(Vec4 *)(yellow.m_data + 2),(Vec4 *)c1
            );
  this_00 = Context::getTestContext
                      ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.
                       super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_00);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_b8,(Surface *)local_58);
  tcu::RGBA::RGBA(&local_bc,1,1,1,1);
  bVar1 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_b8,result,local_bc,COMPARE_LOG_RESULT)
  ;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Pass",&local_109);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Image verification failed",&local_e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  local_e8 = 1;
  tcu::Surface::~Surface((Surface *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), yellow, green, green, yellow);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}